

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O1

FieldMap * __thiscall FIX::FieldMap::operator=(FieldMap *this,FieldMap *rhs)

{
  int iVar1;
  
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::_M_move_assign
            (&this->m_fields,&rhs->m_fields);
  std::
  map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
  ::operator=(&this->m_groups,&rhs->m_groups);
  iVar1 = (rhs->m_order).m_delim;
  (this->m_order).m_mode = (rhs->m_order).m_mode;
  (this->m_order).m_delim = iVar1;
  shared_array<int>::operator=(&(this->m_order).m_groupOrder,&(rhs->m_order).m_groupOrder);
  (this->m_order).m_largest = (rhs->m_order).m_largest;
  return this;
}

Assistant:

FieldMap &FieldMap::operator=(FieldMap &&rhs) {
  m_fields = std::move(rhs.m_fields);
  m_groups = std::move(rhs.m_groups);
  m_order = std::move(rhs.m_order);
  return *this;
}